

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O0

void scalar_wnaf(int8_t *out,uchar *in)

{
  int iVar1;
  byte *in_RSI;
  long in_RDI;
  int8_t d;
  int8_t window;
  int i;
  undefined1 local_16;
  undefined1 local_15;
  undefined4 local_14;
  
  local_15 = *in_RSI & 0x3f;
  for (local_14 = 0; local_14 < 0x201; local_14 = local_14 + 1) {
    local_16 = 0;
    if (((local_15 & 1) != 0) && (local_16 = local_15 & 0x3f, (local_15 & 0x20) != 0)) {
      local_16 = local_16 - 0x40;
    }
    *(byte *)(in_RDI + local_14) = local_16;
    iVar1 = scalar_get_bit(in_RSI,local_14 + 6);
    local_15 = (char)((int)(char)local_15 - (int)(char)local_16 >> 1) + (char)(iVar1 << 5);
  }
  return;
}

Assistant:

static void scalar_wnaf(int8_t out[513], const unsigned char in[64]) {
    int i;
    int8_t window, d;

    window = in[0] & (DRADIX_WNAF - 1);
    for (i = 0; i < 513; i++) {
        d = 0;
        if ((window & 1) && ((d = window & (DRADIX_WNAF - 1)) & DRADIX))
            d -= DRADIX_WNAF;
        out[i] = d;
        window = (window - d) >> 1;
        window += scalar_get_bit(in, i + 1 + RADIX) << RADIX;
    }
}